

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O1

int f32_compare(float32 xa,float32 xb,_Bool is_quiet,float_status *s)

{
  int iVar1;
  
  if (s->flush_inputs_to_zero != '\0') {
    if ((xa & 0x7fffffff) != 0 && (xa & 0x7f800000) == 0) {
      xa = xa & 0x80000000;
      s->float_exception_flags = s->float_exception_flags | 0x40;
    }
    if ((xb & 0x7fffffff) != 0 && (xb & 0x7f800000) == 0) {
      xb = xb & 0x80000000;
      s->float_exception_flags = s->float_exception_flags | 0x40;
    }
  }
  if ((float)xa < (float)xb) {
    if ((float)xa < (float)xb) {
      return -1;
    }
    iVar1 = soft_f32_compare(xa,xb,is_quiet,s);
    return iVar1;
  }
  return (int)((float)xb < (float)xa);
}

Assistant:

static int QEMU_FLATTEN
f32_compare(float32 xa, float32 xb, bool is_quiet, float_status *s)
{
    union_float32 ua, ub;

    ua.s = xa;
    ub.s = xb;

    if (QEMU_NO_HARDFLOAT) {
        goto soft;
    }

    float32_input_flush2(&ua.s, &ub.s, s);
    if (isgreaterequal(ua.h, ub.h)) {
        if (isgreater(ua.h, ub.h)) {
            return float_relation_greater;
        }
        return float_relation_equal;
    }
    if (likely(isless(ua.h, ub.h))) {
        return float_relation_less;
    }
    /* The only condition remaining is unordered.
     * Fall through to set flags.
     */
 soft:
    return soft_f32_compare(ua.s, ub.s, is_quiet, s);
}